

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O2

void readMessages(void)

{
  int iVar1;
  int __n;
  int __fd;
  MessageReceiver rx;
  _Any_data local_c8;
  undefined8 local_b8;
  undefined8 uStack_b0;
  code *local_a0 [2];
  code *local_90;
  code *local_88;
  MessageReceiver local_80;
  
  unixsocketipc::MessageReceiver::MessageReceiver(&local_80);
  local_a0[1] = (code *)0x0;
  local_a0[0] = callback;
  local_88 = std::
             _Function_handler<void_(unsigned_int,_const_char_*,_unsigned_int),_void_(*)(unsigned_int,_const_char_*,_unsigned_int)>
             ::_M_invoke;
  local_90 = std::
             _Function_handler<void_(unsigned_int,_const_char_*,_unsigned_int),_void_(*)(unsigned_int,_const_char_*,_unsigned_int)>
             ::_M_manager;
  local_c8._M_unused._M_object = (void *)0x0;
  local_c8._8_8_ = 0;
  local_b8 = 0;
  uStack_b0 = 0;
  __fd = 0x10302e;
  iVar1 = unixsocketipc::MessageReceiver::init
                    (&local_80,(EVP_PKEY_CTX *)"/tmp/MessageSenderReceiverSocket");
  std::_Function_base::~_Function_base((_Function_base *)&local_c8);
  std::_Function_base::~_Function_base((_Function_base *)local_a0);
  if ((char)iVar1 == '\0') {
    puts("rx.init failed.");
  }
  else {
    puts("reader ready. waiting for connection...");
    unixsocketipc::MessageReceiver::listen(&local_80,__fd,__n);
  }
  unixsocketipc::MessageReceiver::~MessageReceiver(&local_80);
  return;
}

Assistant:

void readMessages() {
   MessageReceiver rx;
   if (!rx.init("/tmp/MessageSenderReceiverSocket", callback)) {
      printf("rx.init failed.\n");
      return;
   }

   printf("reader ready. waiting for connection...\n");
   rx.listen();
}